

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addTargets.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* helics::
  getTagPair<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *tagValue)

{
  string_view defVal;
  bool bVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  string val;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *element;
  _Alloc_hider in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined4 local_9c;
  basic_string_view<char,_std::char_traits<char>_> local_98 [2];
  allocator<char> local_71 [113];
  
  element = in_RDI;
  fileops::getName((json *)in_stack_fffffffffffffef8);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x69a3d6);
  if (bVar1) {
    in_stack_fffffffffffffef0 = &local_c0;
    std::__cxx11::string::string(in_stack_ffffffffffffff00);
    __x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffff20;
    std::__cxx11::string::string(in_stack_ffffffffffffff00);
    std::make_pair<std::__cxx11::string,std::__cxx11::string>(__x,in_stack_fffffffffffffef0);
    std::__cxx11::string::~string(in_stack_fffffffffffffef0);
    std::__cxx11::string::~string(in_stack_fffffffffffffef0);
    local_9c = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (allocator<char> *)in_stack_ffffffffffffff20._M_p);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_98);
    defVal._M_str = in_stack_ffffffffffffff28;
    defVal._M_len = (size_t)in_stack_ffffffffffffff20._M_p;
    fileops::getOrDefault((json *)element,&in_RDI->first,defVal);
    std::__cxx11::string::~string(in_stack_fffffffffffffef0);
    std::allocator<char>::~allocator(local_71);
    std::make_pair<std::__cxx11::string_const&,std::__cxx11::string_const&>
              (in_stack_fffffffffffffef8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffef0);
    local_9c = 1;
    std::__cxx11::string::~string(in_stack_fffffffffffffef0);
  }
  std::__cxx11::string::~string(in_stack_fffffffffffffef0);
  return element;
}

Assistant:

static std::pair<std::string, std::string> getTagPair(const TV& tagValue)
{
    const std::string name = fileops::getName(tagValue);
    if (name.empty()) {
    } else {
        const std::string val =
            fileops::getOrDefault(tagValue, std::string("value"), std::string_view{});
        return std::make_pair(name, val);
    }

    return std::make_pair(std::string{}, std::string{});
}